

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,parameter_type *param_2)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  wostream *pwVar3;
  wostream *in_RDI;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  pwVar3 = std::operator<<(in_RDI,'(');
  std::operator<<(pwVar3,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const parameter_type &) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << ')';
        out.flags(flags);
        return out;
      }